

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_putch(wchar_t x,wchar_t y,wchar_t a,wchar_t c)

{
  errr eVar1;
  
  eVar1 = Term_gotoxy(x,y);
  if (eVar1 != 0) {
    return -1;
  }
  eVar1 = Term_addch(a,c);
  return eVar1;
}

Assistant:

errr Term_putch(int x, int y, int a, wchar_t c)
{
	errr res;

	/* Move first */
	if ((res = Term_gotoxy(x, y)) != 0) return (res);

	/* Then add the char */
	if ((res = Term_addch(a, c)) != 0) return (res);

	/* Success */
	return (0);
}